

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_hash_map.h
# Opt level: O0

bool __thiscall
crnlib::
hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
::insert_no_grow(hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *this,insert_result *result,uint *k,empty_type *v)

{
  bool bVar1;
  uint uVar2;
  iterator local_78;
  iterator local_68;
  uint local_54;
  undefined1 local_50 [4];
  int orig_index;
  value_type *local_40;
  node *pNode;
  empty_type *peStack_30;
  int index;
  empty_type *v_local;
  uint *k_local;
  insert_result *result_local;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  *this_local;
  
  peStack_30 = v;
  v_local = (empty_type *)k;
  k_local = (uint *)result;
  result_local = (insert_result *)this;
  uVar2 = vector<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
          ::size(&this->m_values);
  if (uVar2 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pNode._4_4_ = hash_key(this,(uint *)v_local);
    local_40 = &get_node(this,pNode._4_4_)->super_value_type;
    if (local_40->field_0x5 == '\0') {
LAB_00161de9:
      if (this->m_num_valid < this->m_grow_threshold) {
        construct_value_type(local_40,(uint *)v_local,peStack_30);
        local_40->field_0x5 = 1;
        this->m_num_valid = this->m_num_valid + 1;
        iterator::iterator(&local_78,this,pNode._4_4_);
        iterator::operator=((iterator *)k_local,&local_78);
        *(undefined1 *)(k_local + 4) = 1;
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      bVar1 = equal_to<unsigned_int>::operator()
                        ((equal_to<unsigned_int> *)&this->field_0x15,&local_40->first,
                         (uint *)v_local);
      if (bVar1) {
        iterator::iterator((iterator *)local_50,this,pNode._4_4_);
        iterator::operator=((iterator *)k_local,(iterator *)local_50);
        *(undefined1 *)(k_local + 4) = 0;
        this_local._7_1_ = true;
      }
      else {
        local_54 = pNode._4_4_;
        do {
          if (pNode._4_4_ == 0) {
            uVar2 = vector<crnlib::hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>::raw_node>
                    ::size(&this->m_values);
            pNode._4_4_ = uVar2 - 1;
            local_40 = &get_node(this,pNode._4_4_)->super_value_type;
          }
          else {
            pNode._4_4_ = pNode._4_4_ - 1;
            local_40 = local_40 + -1;
          }
          if (local_54 == pNode._4_4_) {
            return false;
          }
          if (local_40->field_0x5 == '\0') goto LAB_00161de9;
          bVar1 = equal_to<unsigned_int>::operator()
                            ((equal_to<unsigned_int> *)&this->field_0x15,&local_40->first,
                             (uint *)v_local);
        } while (!bVar1);
        iterator::iterator(&local_68,this,pNode._4_4_);
        iterator::operator=((iterator *)k_local,&local_68);
        *(undefined1 *)(k_local + 4) = 0;
        this_local._7_1_ = true;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

inline bool insert_no_grow(insert_result& result, const Key& k, const Value& v = Value())
        {
            if (!m_values.size())
            {
                return false;
            }

            int index = hash_key(k);
            node* pNode = &get_node(index);

            if (pNode->state)
            {
                if (m_equals(pNode->first, k))
                {
                    result.first = iterator(*this, index);
                    result.second = false;
                    return true;
                }

                const int orig_index = index;

                for (;;)
                {
                    if (!index)
                    {
                        index = m_values.size() - 1;
                        pNode = &get_node(index);
                    }
                    else
                    {
                        index--;
                        pNode--;
                    }

                    if (orig_index == index)
                    {
                        return false;
                    }

                    if (!pNode->state)
                    {
                        break;
                    }

                    if (m_equals(pNode->first, k))
                    {
                        result.first = iterator(*this, index);
                        result.second = false;
                        return true;
                    }
                }
            }

            if (m_num_valid >= m_grow_threshold)
            {
                return false;
            }

            construct_value_type(pNode, k, v);

            pNode->state = cStateValid;

            m_num_valid++;
            CRNLIB_ASSERT(m_num_valid <= m_values.size());

            result.first = iterator(*this, index);
            result.second = true;

            return true;
        }